

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.cpp
# Opt level: O0

int VCFrontEnd::exec(int argc,char **argv)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  int iVar4;
  time_t tVar5;
  MeshSimplify *def;
  char *pcVar6;
  VertexClustering *this;
  ostream *poVar7;
  stat *__buf;
  string *__file;
  int in_EDI;
  double _ratio;
  VertexClustering *vc;
  FILE *_;
  MeshSimplify *ms;
  string out_str;
  string in_str;
  Options opts;
  InputParser input;
  VertexClustering *in_stack_fffffffffffffba0;
  InputParser *in_stack_fffffffffffffba8;
  string *in_stack_fffffffffffffbb8;
  MeshSimplify *pMVar8;
  MeshSimplify *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbe8;
  int def_00;
  undefined7 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf7;
  InputParser *in_stack_fffffffffffffbf8;
  allocator *paVar9;
  InputParser *in_stack_fffffffffffffc00;
  undefined7 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  VertexClustering *in_stack_fffffffffffffc20;
  bool local_332;
  allocator local_319;
  string local_318 [32];
  FILE *local_2f8;
  MeshSimplify *local_2f0;
  allocator local_2e1;
  string local_2e0 [8];
  string *in_stack_fffffffffffffd28;
  VertexClustering *in_stack_fffffffffffffd30;
  allocator local_2b9;
  string local_2b8 [8];
  VertexClustering *in_stack_fffffffffffffd50;
  allocator local_291;
  string local_290 [32];
  string local_270 [32];
  MeshSimplify *in_stack_fffffffffffffdb0;
  allocator<char> local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [8];
  string *in_stack_fffffffffffffe58;
  VertexClustering *in_stack_fffffffffffffe60;
  Options *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  MeshSimplify *in_stack_fffffffffffffe90;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  undefined4 local_78;
  allocator local_61;
  string local_60 [32];
  long local_40;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  int local_34;
  int local_30;
  int local_8;
  int local_4;
  
  def_00 = (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20);
  local_8 = in_EDI;
  VCTools::InputParser::InputParser
            (in_stack_fffffffffffffc00,(int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),
             (char **)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0));
  local_38 = 0;
  local_37 = 0;
  local_40 = 400;
  local_36 = 0;
  local_35 = 0;
  local_34 = 2;
  tVar5 = time((time_t *)0x0);
  local_30 = (int)tVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"-h",&local_61);
  local_332 = VCTools::InputParser::cmdOptionExists
                        ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
  local_332 = local_332 || local_8 < 2;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  if (local_332) {
    showHelpPage();
    local_4 = 0;
    local_78 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"-q",&local_99);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    if (bVar1) {
      local_36 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"-o1",&local_c1);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    if (bVar1) {
      local_38 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"-o2",&local_e9);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    if (bVar1) {
      local_37 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"-o3",&local_111);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    if (bVar1) {
      local_37 = 1;
      local_36 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"-v",&local_139);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    if (bVar1) {
      local_35 = 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"-n",&local_161);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe78,"-n",(allocator *)&stack0xfffffffffffffe77);
      iVar4 = VCTools::InputParser::getIntArg
                        (in_stack_fffffffffffffbf8,
                         (string *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                         def_00);
      local_40 = (long)iVar4;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b0,"-r",&local_1b1);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"-r",&local_1d9);
      local_34 = VCTools::InputParser::getIntArg
                           (in_stack_fffffffffffffbf8,
                            (string *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),
                            def_00);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"-seed",&local_201);
    bVar1 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    if (bVar1) {
      in_stack_fffffffffffffc20 = (VertexClustering *)&local_229;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"-seed",(allocator *)in_stack_fffffffffffffc20);
      in_stack_fffffffffffffc1c =
           VCTools::InputParser::getIntArg
                     (in_stack_fffffffffffffbf8,
                      (string *)CONCAT17(in_stack_fffffffffffffbf7,in_stack_fffffffffffffbf0),def_00
                     );
      local_30 = in_stack_fffffffffffffc1c;
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator(&local_229);
    }
    VCTools::InputParser::getLastArg_abi_cxx11_(in_stack_fffffffffffffba8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_290,"-f",&local_291);
    uVar2 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    if ((bool)uVar2) {
      paVar9 = &local_2b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b8,"-f",paVar9);
      VCTools::InputParser::getCmdOption
                ((InputParser *)CONCAT17(uVar2,in_stack_fffffffffffffc08),(string *)paVar9);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    }
    else {
      genOutputFileName(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    }
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator((allocator<char> *)&local_291);
    paVar9 = &local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,"-quad",paVar9);
    bVar3 = VCTools::InputParser::cmdOptionExists
                      ((InputParser *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    if ((bVar3 & 1) == 0) {
      this = (VertexClustering *)operator_new(0xd8);
      VertexClustering::VertexClustering
                (in_stack_fffffffffffffc20,
                 (Options *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      VertexClustering::input(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      VertexClustering::start(in_stack_fffffffffffffba0);
      VertexClustering::build(in_stack_fffffffffffffd50);
      __file = local_270;
      VertexClustering::output(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      VertexClustering::stat(this,(char *)__file,__buf);
      poVar7 = std::operator<<((ostream *)&std::cout,"file saved in ");
      poVar7 = std::operator<<(poVar7,local_270);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    else {
      def = (MeshSimplify *)operator_new(0x20);
      MeshSimplify::MeshSimplify(in_stack_fffffffffffffbc0);
      local_2f0 = def;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_2f8 = freopen(pcVar6,"r",_stdin);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_2f8 = freopen(pcVar6,"w",_stdout);
      pMVar8 = local_2f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_318,"-ratio",&local_319);
      _ratio = VCTools::InputParser::getFloatArg
                         ((InputParser *)paVar9,(string *)CONCAT17(bVar3,in_stack_fffffffffffffbf0),
                          (double)def);
      MeshSimplify::setRatio(pMVar8,_ratio);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      MeshSimplify::input(in_stack_fffffffffffffdb0);
      MeshSimplify::start(in_stack_fffffffffffffe90);
      MeshSimplify::output((MeshSimplify *)in_stack_fffffffffffffc20);
      if (local_2f0 != (MeshSimplify *)0x0) {
        pMVar8 = local_2f0;
        MeshSimplify::~MeshSimplify(local_2f0);
        operator_delete(pMVar8);
      }
    }
    local_4 = 0;
    local_78 = 1;
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb0);
  }
  VCTools::InputParser::~InputParser((InputParser *)0x27a8fe);
  return local_4;
}

Assistant:

int VCFrontEnd::exec(int argc, char** argv) {
	VCTools::InputParser input(argc, argv);
	VertexClustering::Options opts;
	opts.adaptive = false;
	opts.anisotropic = false;
	opts.numCluster = 400;
	opts.quadMetric = false;
	opts.validation = false;
	opts.ringLevel = 2;
	opts.seed = time(0);
	if (input.cmdOptionExists("-h") || argc < 2) {
		showHelpPage();
		return 0;
	}
	if (input.cmdOptionExists("-q")) opts.quadMetric = true;
	if (input.cmdOptionExists("-o1")) opts.adaptive = true;
	if (input.cmdOptionExists("-o2")) opts.anisotropic = true;
	if (input.cmdOptionExists("-o3")) {
		opts.anisotropic = true; 
		opts.quadMetric = true;
	}
	if (input.cmdOptionExists("-v")) opts.validation = true;
	if (input.cmdOptionExists("-n")) 
		opts.numCluster = input.getIntArg("-n", opts.numCluster);
	if (input.cmdOptionExists("-r")) 
		opts.ringLevel = input.getIntArg("-r", opts.ringLevel);
	if (input.cmdOptionExists("-seed")) 
		opts.seed = input.getIntArg("-seed", opts.seed);
	string in_str = input.getLastArg();
	string out_str = input.cmdOptionExists("-f") ? input.getCmdOption("-f") : genOutputFileName(in_str, opts);

	if (input.cmdOptionExists("-quad")) {
		MeshSimplify *ms = new MeshSimplify();
		FILE *_;
		_ = freopen(in_str.c_str(), "r", stdin);
		_ = freopen(out_str.c_str(), "w", stdout);
		ms->setRatio(input.getFloatArg("-ratio", 0.1));
		ms->input();
		ms->start();
		ms->output();
		delete ms;
		return 0;
	}
	VertexClustering* vc = new VertexClustering(opts);
	vc->input(in_str);
	vc->start();
	vc->build();
	vc->output(out_str);
	vc->stat();
	cout << "file saved in " << out_str << endl;
	return 0;
}